

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableIntTest_SerializingToStringStream_Test
          (HashtableIntTest_SerializingToStringStream_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c23be8;
  (this->
  super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c23ca8;
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&(this->
             super_HashtableIntTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.table.groups);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToStringStream) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  std::stringstream string_buffer;
  EXPECT_TRUE(ht_out.serialize(typename TypeParam::NopointerSerializer(),
                               &string_buffer));

  TypeParam ht_in;
  EXPECT_TRUE(ht_in.unserialize(typename TypeParam::NopointerSerializer(),
                                &string_buffer));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}